

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

void rx__log(rx_log_level level,char *file,int line,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  rx__log_style local_5c [2];
  rx__log_style level_style;
  va_list args;
  char *level_style_end;
  char *level_style_begin;
  char *level_name;
  char *fmt_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  rx_log_level level_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_f8 = in_R8;
  local_f0 = in_R9;
  level_name = fmt;
  fmt_local._4_4_ = line;
  pcStack_18 = file;
  file_local._4_4_ = level;
  if (file != (char *)0x0) {
    if (fmt != (char *)0x0) {
      rx__log_level_get_name(&level_style_begin,level);
      iVar1 = fileno(_stderr);
      iVar1 = isatty(iVar1);
      if (iVar1 == 0) {
        args[0].reg_save_area = "";
        level_style_end = "";
      }
      else {
        rx__log_level_get_style(local_5c,file_local._4_4_);
        rx__log_style_get_ansi_code(&level_style_end,local_5c[0]);
        rx__log_style_get_ansi_code((char **)&args[0].reg_save_area,RX__LOG_STYLE_RESET);
      }
      args[0].overflow_arg_area = local_118;
      args[0]._0_8_ = &stack0x00000008;
      level_style = 0x30;
      local_5c[1] = 0x20;
      fprintf(_stderr,"%s:%d: %s%s%s: ",pcStack_18,(ulong)fmt_local._4_4_,level_style_end,
              level_style_begin,args[0].reg_save_area);
      vfprintf(_stderr,level_name,local_5c + 1);
      return;
    }
    __assert_fail("fmt != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1107,"void rx__log(enum rx_log_level, const char *, int, const char *, ...)");
  }
  __assert_fail("file != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1106,"void rx__log(enum rx_log_level, const char *, int, const char *, ...)");
}

Assistant:

static void
rx__log(enum rx_log_level level,
        const char *file,
        int line,
        const char *fmt,
        ...)
{
    const char *level_name;
    const char *level_style_begin;
    const char *level_style_end;
    va_list args;

    RX_ASSERT(file != NULL);
    RX_ASSERT(fmt != NULL);

    rx__log_level_get_name(&level_name, level);

#if RX__LOG_STYLING
    if (RX__ISATTY(RX__FILENO(stderr))) {
        enum rx__log_style level_style;

        rx__log_level_get_style(&level_style, level);
        rx__log_style_get_ansi_code(&level_style_begin, level_style);
        rx__log_style_get_ansi_code(&level_style_end, RX__LOG_STYLE_RESET);
    } else {
        level_style_begin = level_style_end = "";
    }
#else
    level_style_begin = level_style_end = "";
#endif

    va_start(args, fmt);
    fprintf(stderr,
            "%s:%d: %s%s%s: ",
            file,
            line,
            level_style_begin,
            level_name,
            level_style_end);
    vfprintf(stderr, fmt, args);
    va_end(args);
}